

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O1

void g_slider_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("hsl");
  slider_class = class_new(ptVar2,slider_new,slider_free,0x4c0,0,A_GIMME,0);
  ptVar2 = gensym("vsl");
  class_addcreator(slider_new,ptVar2,A_GIMME,0);
  ptVar2 = gensym("hslider");
  class_addcreator(slider_new,ptVar2,A_GIMME,0);
  ptVar2 = gensym("vslider");
  class_addcreator(slider_new,ptVar2,A_GIMME,0);
  class_addbang(slider_class,slider_bang);
  class_doaddfloat(slider_class,slider_float);
  p_Var1 = slider_class;
  ptVar2 = gensym("click");
  class_addmethod(p_Var1,slider_click,ptVar2,A_FLOAT,1,1,1,1,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("motion");
  class_addmethod(p_Var1,slider_motion,ptVar2,A_FLOAT,1,6,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("dialog");
  class_addmethod(p_Var1,slider_dialog,ptVar2,A_GIMME,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("loadbang");
  class_addmethod(p_Var1,slider_loadbang,ptVar2,A_DEFFLOAT,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("set");
  class_addmethod(p_Var1,slider_set,ptVar2,A_FLOAT,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("size");
  class_addmethod(p_Var1,slider_size,ptVar2,A_GIMME,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("delta");
  class_addmethod(p_Var1,slider_delta,ptVar2,A_GIMME,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("pos");
  class_addmethod(p_Var1,slider_pos,ptVar2,A_GIMME,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("range");
  class_addmethod(p_Var1,slider_range,ptVar2,A_GIMME,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("color");
  class_addmethod(p_Var1,slider_color,ptVar2,A_GIMME,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("send");
  class_addmethod(p_Var1,slider_send,ptVar2,A_DEFSYM,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("receive");
  class_addmethod(p_Var1,slider_receive,ptVar2,A_DEFSYM,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("label");
  class_addmethod(p_Var1,slider_label,ptVar2,A_DEFSYM,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("label_pos");
  class_addmethod(p_Var1,slider_label_pos,ptVar2,A_GIMME,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("label_font");
  class_addmethod(p_Var1,slider_label_font,ptVar2,A_GIMME,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("log");
  class_addmethod(p_Var1,slider_log,ptVar2,A_NULL);
  p_Var1 = slider_class;
  ptVar2 = gensym("lin");
  class_addmethod(p_Var1,slider_lin,ptVar2,A_NULL);
  p_Var1 = slider_class;
  ptVar2 = gensym("init");
  class_addmethod(p_Var1,slider_init,ptVar2,A_FLOAT,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("steady");
  class_addmethod(p_Var1,slider_steady,ptVar2,A_FLOAT,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("orientation");
  class_addmethod(p_Var1,slider_orientation,ptVar2,A_FLOAT,0);
  p_Var1 = slider_class;
  ptVar2 = gensym("zoom");
  class_addmethod(p_Var1,slider_zoom,ptVar2,A_CANT,0);
  slider_widgetbehavior.w_getrectfn = slider_getrect;
  slider_widgetbehavior.w_displacefn = iemgui_displace;
  slider_widgetbehavior.w_selectfn = iemgui_select;
  slider_widgetbehavior.w_activatefn = (t_activatefn)0x0;
  slider_widgetbehavior.w_deletefn = iemgui_delete;
  slider_widgetbehavior.w_visfn = iemgui_vis;
  slider_widgetbehavior.w_clickfn = slider_newclick;
  class_setwidget(slider_class,&slider_widgetbehavior);
  p_Var1 = slider_class;
  ptVar2 = gensym("sliders");
  class_sethelpsymbol(p_Var1,ptVar2);
  class_setsavefn(slider_class,slider_save);
  class_setpropertiesfn(slider_class,slider_properties);
  return;
}

Assistant:

void g_slider_setup(void)
{
    slider_class = class_new(gensym("hsl"), (t_newmethod)slider_new,
        (t_method)slider_free, sizeof(t_slider), 0, A_GIMME, 0);
    class_addcreator((t_newmethod)slider_new, gensym("vsl"), A_GIMME, 0);
    class_addcreator((t_newmethod)slider_new, gensym("hslider"), A_GIMME, 0);
    class_addcreator((t_newmethod)slider_new, gensym("vslider"), A_GIMME, 0);

    class_addbang(slider_class, slider_bang);
    class_addfloat(slider_class, slider_float);
    class_addmethod(slider_class, (t_method)slider_click,
        gensym("click"), A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, A_FLOAT, 0);
    class_addmethod(slider_class, (t_method)slider_motion,
        gensym("motion"), A_FLOAT, A_FLOAT, A_DEFFLOAT, 0);
    class_addmethod(slider_class, (t_method)slider_dialog,
        gensym("dialog"), A_GIMME, 0);
    class_addmethod(slider_class, (t_method)slider_loadbang,
        gensym("loadbang"), A_DEFFLOAT, 0);
    class_addmethod(slider_class, (t_method)slider_set,
        gensym("set"), A_FLOAT, 0);
    class_addmethod(slider_class, (t_method)slider_size,
        gensym("size"), A_GIMME, 0);
    class_addmethod(slider_class, (t_method)slider_delta,
        gensym("delta"), A_GIMME, 0);
    class_addmethod(slider_class, (t_method)slider_pos,
        gensym("pos"), A_GIMME, 0);
    class_addmethod(slider_class, (t_method)slider_range,
        gensym("range"), A_GIMME, 0);
    class_addmethod(slider_class, (t_method)slider_color,
        gensym("color"), A_GIMME, 0);
    class_addmethod(slider_class, (t_method)slider_send,
        gensym("send"), A_DEFSYM, 0);
    class_addmethod(slider_class, (t_method)slider_receive,
        gensym("receive"), A_DEFSYM, 0);
    class_addmethod(slider_class, (t_method)slider_label,
        gensym("label"), A_DEFSYM, 0);
    class_addmethod(slider_class, (t_method)slider_label_pos,
        gensym("label_pos"), A_GIMME, 0);
    class_addmethod(slider_class, (t_method)slider_label_font,
        gensym("label_font"), A_GIMME, 0);
    class_addmethod(slider_class, (t_method)slider_log,
        gensym("log"), 0);
    class_addmethod(slider_class, (t_method)slider_lin,
        gensym("lin"), 0);
    class_addmethod(slider_class, (t_method)slider_init,
        gensym("init"), A_FLOAT, 0);
    class_addmethod(slider_class, (t_method)slider_steady,
        gensym("steady"), A_FLOAT, 0);
    class_addmethod(slider_class, (t_method)slider_orientation,
        gensym("orientation"), A_FLOAT, 0);
    class_addmethod(slider_class, (t_method)slider_zoom,
        gensym("zoom"), A_CANT, 0);
    slider_widgetbehavior.w_getrectfn =    slider_getrect;
    slider_widgetbehavior.w_displacefn =   iemgui_displace;
    slider_widgetbehavior.w_selectfn =     iemgui_select;
    slider_widgetbehavior.w_activatefn =   NULL;
    slider_widgetbehavior.w_deletefn =     iemgui_delete;
    slider_widgetbehavior.w_visfn =        iemgui_vis;
    slider_widgetbehavior.w_clickfn =      slider_newclick;
    class_setwidget(slider_class, &slider_widgetbehavior);
    class_sethelpsymbol(slider_class, gensym("sliders"));
    class_setsavefn(slider_class, slider_save);
    class_setpropertiesfn(slider_class, slider_properties);
}